

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_field.h
# Opt level: O0

ImmutableFieldGenerator * __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this,
          FieldDescriptor *field)

{
  Descriptor *pDVar1;
  char *pcVar2;
  scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_00;
  ImmutableFieldGenerator *pIVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __c;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_local;
  
  local_18 = field;
  field_local = (FieldDescriptor *)this;
  pDVar1 = FieldDescriptor::containing_type(field);
  local_51 = 0;
  __c = extraout_EDX;
  if (pDVar1 != this->descriptor_) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
               ,0x98);
    local_51 = 1;
    field = (FieldDescriptor *)
            internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (field->containing_type()) == (descriptor_): ");
    internal::LogFinisher::operator=(local_65,(LogMessage *)field);
    __c = extraout_EDX_00;
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
    __c = extraout_EDX_01;
  }
  pcVar2 = FieldDescriptor::index(local_18,(char *)field,__c);
  this_00 = internal::
            scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
            ::operator[](&this->field_generators_,(long)(int)pcVar2);
  pIVar3 = internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>::
           operator*(this_00);
  return pIVar3;
}

Assistant:

inline const FieldGeneratorType&
FieldGeneratorMap<FieldGeneratorType>::get(const FieldDescriptor* field) const {
  GOOGLE_CHECK_EQ(field->containing_type(), descriptor_);
  return *field_generators_[field->index()];
}